

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestRegistry::getMatchingTestCases
          (TestRegistry *this,string *rawTestSpec,
          vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestsOut)

{
  bool bVar1;
  reference pTVar2;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_58;
  const_iterator itEnd;
  const_iterator it;
  TestCaseFilter filter;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestsOut_local;
  string *rawTestSpec_local;
  TestRegistry *this_local;
  
  TestCaseFilter::TestCaseFilter((TestCaseFilter *)&it,rawTestSpec,AutoDetectBehaviour);
  itEnd = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                    (&this->m_functionsInOrder);
  local_58._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                 (&this->m_functionsInOrder);
  while (bVar1 = __gnu_cxx::operator!=(&itEnd,&local_58), bVar1) {
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator*(&itEnd);
    bVar1 = TestCaseFilter::shouldInclude((TestCaseFilter *)&it,pTVar2);
    if (bVar1) {
      pTVar2 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&itEnd);
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                (matchingTestsOut,pTVar2);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&itEnd);
  }
  TestCaseFilter::~TestCaseFilter((TestCaseFilter *)&it);
  return;
}

Assistant:

virtual void getMatchingTestCases( std::string const& rawTestSpec, std::vector<TestCase>& matchingTestsOut ) const {
            TestCaseFilter filter( rawTestSpec );

            std::vector<TestCase>::const_iterator it = m_functionsInOrder.begin();
            std::vector<TestCase>::const_iterator itEnd = m_functionsInOrder.end();
            for(; it != itEnd; ++it ) {
                if( filter.shouldInclude( *it ) ) {
                    matchingTestsOut.push_back( *it );
                }
            }
        }